

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void av1_highbd_inv_txfm2d_add_universe_sse4_1
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  byte bVar1;
  char *pcVar2;
  transform_1d_sse4_1 p_Var3;
  transform_1d_sse4_1 p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  byte bVar11;
  uint uVar12;
  __m128i *palVar13;
  int32_t *piVar14;
  undefined8 *puVar15;
  undefined1 (*pauVar16) [16];
  longlong *plVar17;
  byte bVar18;
  undefined7 in_register_00000009;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  undefined8 *puVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  longlong *plVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  bool bVar37;
  __m128i round;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar42 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar43 [16];
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined8 extraout_XMM1_Qb_02;
  int iVar46;
  int iVar47;
  int iVar62;
  int iVar63;
  undefined1 in_XMM2 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  int iVar65;
  int iVar72;
  int iVar73;
  undefined1 in_XMM3 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar74;
  undefined1 auVar71 [16];
  __m128i buf1 [1024];
  int local_44c8;
  int local_44c0;
  byte local_4484;
  undefined8 local_4438;
  undefined8 uStack_4430;
  undefined4 auStack_4428 [4];
  undefined4 auStack_4418 [4];
  undefined8 uStack_4408;
  undefined8 uStack_4400;
  longlong local_4038 [6];
  undefined8 local_4008 [2043];
  
  bVar18 = (byte)bd;
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    local_44c8 = 0;
    uVar23 = 0;
    iVar74 = 0;
    if (eob != 1) {
      uVar23 = (int)av1_eob_to_eobxy_default[tx_size]
                    [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] & 0xff;
      iVar74 = (int)av1_eob_to_eobxy_default[tx_size]
                    [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] >> 8;
    }
    uVar34 = (ulong)((uint)tx_size * 4);
    uVar35 = *(uint *)((long)tx_size_wide + uVar34);
    uVar12 = *(uint *)((long)tx_size_high + uVar34);
    uVar36 = (ulong)uVar12;
    uVar29 = (int)uVar35 >> 2;
    uVar24 = 0x20;
    if ((int)uVar12 < 0x20) {
      uVar24 = uVar12;
    }
    if (uVar35 != uVar12) {
      if ((int)uVar12 < (int)uVar35) {
        local_44c8 = 1;
        if ((uVar12 * 2 == uVar35) || (local_44c8 = 2, uVar12 * 4 == uVar35)) goto LAB_003fda6d;
      }
      else {
        local_44c8 = -1;
        if ((uVar35 * 2 == uVar12) || (local_44c8 = -2, uVar35 * 4 == uVar12)) goto LAB_003fda6d;
      }
      local_44c8 = 0;
    }
LAB_003fda6d:
    lVar28 = (long)(int)uVar12;
    pcVar2 = av1_inv_txfm_shift_ls[tx_size];
    bVar37 = 8 < tx_type;
    uVar27 = 0xaf >> (tx_type & 0x1f);
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar34) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[iVar74]];
    uVar30 = iVar74 + 8 >> 2 & 0xfffffffe;
    if (0 < (int)uVar30) {
      p_Var4 = highbd_txfm_all_1d_zeros_w8_arr
               [(long)*(int *)((long)tx_size_wide_log2 + uVar34) + -2][""[tx_type]]
               [lowbd_txfm_all_1d_zeros_idx[uVar23]];
      lVar26 = (ulong)((uVar23 & 0xffffff8) << 4) + 0x80;
      lVar33 = (ulong)uVar29 << 6;
      pauVar20 = (undefined1 (*) [16])(local_4008 + ((long)(int)uVar29 + -1) * lVar28 * 2);
      puVar25 = local_4008;
      uVar34 = 0;
      auVar45 = pmovsxwd(in_XMM1,0xb500b500b500b50);
      auVar48 = pmovsxwd(in_XMM2,0x800080008000800);
      do {
        lVar19 = 0;
        piVar14 = input;
        do {
          uVar9 = *(undefined8 *)(piVar14 + 2);
          *(undefined8 *)((long)&local_4438 + lVar19) = *(undefined8 *)piVar14;
          *(undefined8 *)((long)auStack_4428 + lVar19 + -8) = uVar9;
          lVar19 = lVar19 + 0x10;
          piVar14 = piVar14 + (int)uVar24;
        } while (lVar26 != lVar19);
        if ((local_44c8 == 1) || (local_44c8 == -1)) {
          lVar19 = 0;
          do {
            auVar58 = pmulld(*(undefined1 (*) [16])((long)&local_4438 + lVar19),auVar45);
            *(int *)((long)&local_4438 + lVar19) = auVar58._0_4_ + auVar48._0_4_ >> 0xc;
            *(int *)((long)&local_4438 + lVar19 + 4) = auVar58._4_4_ + auVar48._4_4_ >> 0xc;
            *(int *)((long)auStack_4428 + lVar19 + -8) = auVar58._8_4_ + auVar48._8_4_ >> 0xc;
            *(int *)((long)auStack_4428 + lVar19 + -4) = auVar58._12_4_ + auVar48._12_4_ >> 0xc;
            lVar19 = lVar19 + 0x10;
          } while (lVar26 != lVar19);
        }
        (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
        auVar42._8_8_ = extraout_XMM1_Qb;
        auVar42._0_8_ = extraout_XMM1_Qa;
        if ((0x11fU >> (tx_type & 0x1f) & 1) == 0 && !bVar37) {
          if (0 < (int)uVar29) {
            lVar19 = 0;
            pauVar16 = pauVar20;
            do {
              auVar45 = *(undefined1 (*) [16])((long)auStack_4428 + lVar19);
              uVar5 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
              uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
              auVar66._0_8_ =
                   CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19 + 8),
                            *(undefined4 *)((long)&uStack_4400 + lVar19));
              auVar66._8_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
              auVar66._12_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
              auVar49._0_8_ = auVar45._0_8_;
              auVar49._8_4_ = auVar45._4_4_;
              auVar49._12_4_ = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
              auVar48._8_8_ = auVar49._8_8_;
              auVar48._0_8_ = CONCAT44(*(undefined4 *)((long)&local_4438 + lVar19),auVar45._0_4_);
              auVar42._0_8_ =
                   CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + -8),auVar45._8_4_);
              auVar42._8_4_ = auVar45._12_4_;
              auVar42._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
              *(ulong *)pauVar16[-3] =
                   CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19),
                            *(undefined4 *)((long)&uStack_4408 + lVar19));
              *(undefined8 *)((long)pauVar16[-3] + 8) = auVar48._0_8_;
              *(undefined4 *)((long)pauVar16[-2] + 8) = uVar6;
              *(undefined4 *)((long)pauVar16[-2] + 0xc) = uVar5;
              *(undefined8 *)((long)pauVar16[-2] + 8) = auVar48._8_8_;
              *(undefined8 *)pauVar16[-1] = auVar66._0_8_;
              *(undefined8 *)((long)pauVar16[-1] + 8) = auVar42._0_8_;
              in_XMM3._8_8_ = auVar42._8_8_;
              in_XMM3._0_8_ = auVar66._8_8_;
              *pauVar16 = in_XMM3;
              lVar19 = lVar19 + 0x40;
              pauVar16 = pauVar16 + -lVar28;
            } while (lVar33 != lVar19);
          }
        }
        else if (0 < (int)uVar29) {
          lVar19 = 0;
          puVar15 = puVar25;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar19 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar19);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar19);
            auVar38._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar19 + -8));
            auVar38._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
            auVar38._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar19);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19);
            auVar48._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar19),
                          *(undefined4 *)((long)auStack_4418 + lVar19 + 8));
            auVar48._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
            auVar48._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            auVar42._8_8_ = auVar48._0_8_;
            auVar42._0_8_ = auVar38._0_8_;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar42;
            *puVar15 = auVar38._8_8_;
            puVar15[1] = auVar48._8_8_;
            lVar19 = lVar19 + 0x40;
            puVar15 = puVar15 + lVar28 * 2;
          } while (lVar33 != lVar19);
        }
        uVar34 = uVar34 + 1;
        input = input + 4;
        pauVar20 = pauVar20 + 4;
        puVar25 = puVar25 + 8;
        auVar45 = pmovsxwd(auVar42,0xb500b500b500b50);
        auVar48 = pmovsxwd(auVar48,0x800080008000800);
      } while (uVar34 != uVar30);
    }
    if (0 < (int)uVar29) {
      plVar32 = local_4038;
      uVar34 = 0;
      do {
        (*p_Var3)((__m128i *)(local_4038 + uVar34 * lVar28 * 2),
                  (__m128i *)(local_4038 + uVar34 * lVar28 * 2),0xc,1,bd,0);
        bVar11 = pcVar2[1];
        plVar17 = plVar32;
        uVar21 = uVar36;
        if ((char)bVar11 < '\0') {
          iVar74 = 1 << (~bVar11 & 0x1f);
          auVar45 = ZEXT416((uint)-(int)(char)bVar11);
          do {
            *(int *)plVar17 = (int)*plVar17 + iVar74 >> auVar45;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar74 >> auVar45;
            *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar74 >> auVar45;
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar74 >> auVar45;
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        else {
          do {
            *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar11;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
            *(int *)(plVar17 + 1) = (int)plVar17[1];
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar34 = uVar34 + 1;
        plVar32 = plVar32 + lVar28 * 2;
      } while (uVar34 != uVar29);
    }
    if ((int)uVar35 >> 3 < 1) {
      return;
    }
    pauVar20 = (undefined1 (*) [16])((long)output * 2);
    local_4484 = (byte)uVar27;
    uVar23 = ~(-1 << (bVar18 & 0x1f));
    uVar21 = 0;
    uVar34 = (ulong)(uVar12 - 1);
    if (bVar37 || (uVar27 & 1) != 0) {
      uVar34 = uVar21;
    }
    uVar31 = 0;
    do {
      plVar32 = local_4038 + uVar34 * 2 + (long)(int)uVar21 * 2;
      uVar22 = uVar36;
      pauVar16 = pauVar20;
      do {
        auVar45 = *pauVar16;
        auVar58 = pmovsxwd(in_XMM3,auVar45);
        auVar50._8_4_ = auVar45._8_4_;
        auVar50._12_4_ = auVar45._12_4_;
        auVar50._0_8_ = auVar45._8_8_;
        iVar74 = auVar58._0_4_ + (int)*plVar32;
        iVar65 = auVar58._4_4_ + *(int *)((long)plVar32 + 4);
        iVar72 = auVar58._8_4_ + (int)plVar32[1];
        iVar73 = auVar58._12_4_ + *(int *)((long)plVar32 + 0xc);
        auVar45 = pmovsxwd(auVar50,auVar50);
        plVar17 = plVar32 + uVar36 * 2;
        iVar64 = auVar45._0_4_ + (int)*plVar17;
        iVar47 = auVar45._4_4_ + *(int *)((long)plVar17 + 4);
        iVar62 = auVar45._8_4_ + (int)plVar17[1];
        iVar63 = auVar45._12_4_ + *(int *)((long)plVar17 + 0xc);
        iVar74 = (uint)(-1 < iVar74) * iVar74;
        iVar65 = (uint)(-1 < iVar65) * iVar65;
        iVar72 = (uint)(-1 < iVar72) * iVar72;
        iVar73 = (uint)(-1 < iVar73) * iVar73;
        auVar67._0_4_ = ((int)uVar23 < iVar74) * uVar23 | (uint)((int)uVar23 >= iVar74) * iVar74;
        auVar67._4_4_ = ((int)uVar23 < iVar65) * uVar23 | (uint)((int)uVar23 >= iVar65) * iVar65;
        auVar67._8_4_ = ((int)uVar23 < iVar72) * uVar23 | (uint)((int)uVar23 >= iVar72) * iVar72;
        auVar67._12_4_ = ((int)uVar23 < iVar73) * uVar23 | (uint)((int)uVar23 >= iVar73) * iVar73;
        iVar64 = (uint)(-1 < iVar64) * iVar64;
        iVar47 = (uint)(-1 < iVar47) * iVar47;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar63 = (uint)(-1 < iVar63) * iVar63;
        auVar51._0_4_ = ((int)uVar23 < iVar64) * uVar23 | (uint)((int)uVar23 >= iVar64) * iVar64;
        auVar51._4_4_ = ((int)uVar23 < iVar47) * uVar23 | (uint)((int)uVar23 >= iVar47) * iVar47;
        auVar51._8_4_ = ((int)uVar23 < iVar62) * uVar23 | (uint)((int)uVar23 >= iVar62) * iVar62;
        auVar51._12_4_ = ((int)uVar23 < iVar63) * uVar23 | (uint)((int)uVar23 >= iVar63) * iVar63;
        in_XMM3 = packusdw(auVar67,auVar51);
        *pauVar16 = in_XMM3;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
        plVar32 = (longlong *)((long)plVar32 + ((ulong)(((bVar37 | local_4484) & 1) << 5) - 0x10));
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
      uVar31 = uVar31 + 1;
      pauVar20 = pauVar20 + 1;
      uVar21 = (ulong)((int)uVar21 + uVar12 * 2);
    } while (uVar31 != (uint)((int)uVar35 >> 3));
    return;
  case 9:
    uVar23 = tx_size_wide[tx_size];
    uVar35 = tx_size_high[tx_size];
    uVar34 = (ulong)uVar35;
    uVar12 = 0x20;
    if ((int)uVar35 < 0x20) {
      uVar12 = uVar35;
    }
    uVar24 = 0x20;
    if ((int)uVar23 < 0x20) {
      uVar24 = uVar23;
    }
    uVar29 = (int)uVar24 >> 2;
    local_44c0 = 0;
    if (uVar23 != uVar35) {
      if ((int)uVar35 < (int)uVar23) {
        local_44c0 = 1;
        if ((uVar35 * 2 == uVar23) || (local_44c0 = 2, uVar35 * 4 == uVar23)) goto LAB_003fe630;
      }
      else {
        local_44c0 = -1;
        if ((uVar23 * 2 == uVar35) || (local_44c0 = -2, uVar23 * 4 == uVar35)) goto LAB_003fe630;
      }
      local_44c0 = 0;
    }
LAB_003fe630:
    lVar28 = (long)(int)uVar35;
    pcVar2 = av1_inv_txfm_shift_ls[tx_size];
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)tx_size_high_log2[tx_size] + -2][2][0];
    if (0 < (int)uVar12 >> 2) {
      p_Var4 = highbd_txfm_all_1d_zeros_w8_arr[(long)tx_size_wide_log2[tx_size] + -2][2][0];
      uVar36 = (ulong)uVar24;
      puVar25 = local_4008;
      uVar21 = 0;
      auVar45 = pmovsxwd(in_XMM1,0xb500b500b500b50);
      auVar55 = pmovsxwd(in_XMM2,0x800080008000800);
      do {
        plVar32 = (longlong *)input;
        palVar13 = (__m128i *)&local_4438;
        uVar31 = uVar36;
        do {
          lVar10 = plVar32[1];
          (*palVar13)[0] = *plVar32;
          (*palVar13)[1] = lVar10;
          palVar13 = palVar13 + 1;
          plVar32 = (longlong *)((long)plVar32 + (ulong)uVar12 * 4);
          uVar31 = uVar31 - 1;
        } while (uVar31 != 0);
        palVar13 = (__m128i *)&local_4438;
        uVar31 = uVar36;
        if ((local_44c0 == 1) || (local_44c0 == -1)) {
          do {
            auVar58 = pmulld((undefined1  [16])*palVar13,auVar45);
            *(int *)*palVar13 = auVar58._0_4_ + auVar55._0_4_ >> 0xc;
            *(int *)((long)*palVar13 + 4) = auVar58._4_4_ + auVar55._4_4_ >> 0xc;
            *(int *)(*palVar13 + 1) = auVar58._8_4_ + auVar55._8_4_ >> 0xc;
            *(int *)((long)*palVar13 + 0xc) = auVar58._12_4_ + auVar55._12_4_ >> 0xc;
            uVar31 = uVar31 - 1;
            palVar13 = palVar13 + 1;
          } while (uVar31 != 0);
        }
        (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
        auVar44._8_8_ = extraout_XMM1_Qb_01;
        auVar44._0_8_ = extraout_XMM1_Qa_01;
        if (0 < (int)uVar29) {
          lVar26 = 0;
          puVar15 = puVar25;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar26 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar26 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar26 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar26 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar26);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar26);
            auVar40._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar26 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar26 + -8));
            auVar40._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar26 + -4);
            auVar40._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar26 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar26);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar26);
            auVar55._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar26),
                          *(undefined4 *)((long)auStack_4418 + lVar26 + 8));
            auVar55._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar26 + 0xc);
            auVar55._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar26 + 4);
            *(undefined1 (*) [16])((long)&local_4438 + lVar26) = in_XMM3;
            *(undefined4 *)((long)auStack_4428 + lVar26 + 8) = uVar7;
            *(undefined4 *)((long)auStack_4428 + lVar26 + 0xc) = uVar5;
            *(undefined4 *)((long)auStack_4418 + lVar26) = uVar8;
            *(undefined4 *)((long)auStack_4418 + lVar26 + 4) = uVar6;
            auVar44._8_8_ = auVar55._0_8_;
            auVar44._0_8_ = auVar40._0_8_;
            *(undefined1 (*) [16])((long)auStack_4418 + lVar26) = auVar44;
            *(long *)((long)&uStack_4408 + lVar26) = auVar40._8_8_;
            *(long *)((long)&uStack_4400 + lVar26) = auVar55._8_8_;
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar44;
            *puVar15 = auVar40._8_8_;
            puVar15[1] = auVar55._8_8_;
            lVar26 = lVar26 + 0x40;
            puVar15 = puVar15 + lVar28 * 2;
          } while ((ulong)uVar29 << 6 != lVar26);
        }
        uVar21 = uVar21 + 1;
        input = (int32_t *)((long)input + 0x10);
        puVar25 = puVar25 + 8;
        auVar45 = pmovsxwd(auVar44,0xb500b500b500b50);
        auVar55 = pmovsxwd(auVar55,0x800080008000800);
      } while (uVar21 != (uint)((int)uVar12 >> 2));
    }
    if (0 < (int)uVar29) {
      plVar32 = local_4038;
      uVar36 = 0;
      do {
        (*p_Var3)((__m128i *)(local_4038 + uVar36 * lVar28 * 2),
                  (__m128i *)(local_4038 + uVar36 * lVar28 * 2),0xc,1,bd,0);
        bVar11 = pcVar2[1];
        plVar17 = plVar32;
        uVar21 = uVar34;
        if ((char)bVar11 < '\0') {
          iVar74 = 1 << (~bVar11 & 0x1f);
          auVar45 = ZEXT416((uint)-(int)(char)bVar11);
          do {
            *(int *)plVar17 = (int)*plVar17 + iVar74 >> auVar45;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar74 >> auVar45;
            *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar74 >> auVar45;
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar74 >> auVar45;
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        else {
          do {
            *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar11;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
            *(int *)(plVar17 + 1) = (int)plVar17[1];
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar36 = uVar36 + 1;
        plVar32 = plVar32 + lVar28 * 2;
      } while (uVar36 != uVar29);
    }
    if ((int)uVar23 >> 3 < 1) {
      return;
    }
    pauVar20 = (undefined1 (*) [16])((long)output * 2);
    uVar12 = ~(-1 << (bVar18 & 0x1f));
    iVar74 = 0;
    uVar36 = 0;
    do {
      plVar32 = local_4038 + (long)iVar74 * 2;
      pauVar16 = pauVar20;
      uVar21 = uVar34;
      do {
        auVar45 = *pauVar16;
        auVar58 = pmovsxwd(in_XMM3,auVar45);
        auVar56._8_4_ = auVar45._8_4_;
        auVar56._12_4_ = auVar45._12_4_;
        auVar56._0_8_ = auVar45._8_8_;
        iVar73 = auVar58._0_4_ + (int)*plVar32;
        iVar72 = auVar58._4_4_ + *(int *)((long)plVar32 + 4);
        iVar65 = auVar58._8_4_ + (int)plVar32[1];
        iVar63 = auVar58._12_4_ + *(int *)((long)plVar32 + 0xc);
        auVar45 = pmovsxwd(auVar56,auVar56);
        plVar17 = plVar32 + uVar34 * 2;
        iVar46 = auVar45._0_4_ + (int)*plVar17;
        iVar64 = auVar45._4_4_ + *(int *)((long)plVar17 + 4);
        iVar62 = auVar45._8_4_ + (int)plVar17[1];
        iVar47 = auVar45._12_4_ + *(int *)((long)plVar17 + 0xc);
        iVar73 = (uint)(-1 < iVar73) * iVar73;
        iVar72 = (uint)(-1 < iVar72) * iVar72;
        iVar65 = (uint)(-1 < iVar65) * iVar65;
        iVar63 = (uint)(-1 < iVar63) * iVar63;
        auVar69._0_4_ = ((int)uVar12 < iVar73) * uVar12 | (uint)((int)uVar12 >= iVar73) * iVar73;
        auVar69._4_4_ = ((int)uVar12 < iVar72) * uVar12 | (uint)((int)uVar12 >= iVar72) * iVar72;
        auVar69._8_4_ = ((int)uVar12 < iVar65) * uVar12 | (uint)((int)uVar12 >= iVar65) * iVar65;
        auVar69._12_4_ = ((int)uVar12 < iVar63) * uVar12 | (uint)((int)uVar12 >= iVar63) * iVar63;
        iVar46 = (uint)(-1 < iVar46) * iVar46;
        iVar64 = (uint)(-1 < iVar64) * iVar64;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar47 = (uint)(-1 < iVar47) * iVar47;
        auVar57._0_4_ = ((int)uVar12 < iVar46) * uVar12 | (uint)((int)uVar12 >= iVar46) * iVar46;
        auVar57._4_4_ = ((int)uVar12 < iVar64) * uVar12 | (uint)((int)uVar12 >= iVar64) * iVar64;
        auVar57._8_4_ = ((int)uVar12 < iVar62) * uVar12 | (uint)((int)uVar12 >= iVar62) * iVar62;
        auVar57._12_4_ = ((int)uVar12 < iVar47) * uVar12 | (uint)((int)uVar12 >= iVar47) * iVar47;
        in_XMM3 = packusdw(auVar69,auVar57);
        *pauVar16 = in_XMM3;
        plVar32 = plVar32 + 2;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      uVar36 = uVar36 + 1;
      iVar74 = iVar74 + uVar35 * 2;
      pauVar20 = pauVar20 + 1;
    } while (uVar36 != (uint)((int)uVar23 >> 3));
    return;
  case 10:
  case 0xc:
  case 0xe:
    uVar23 = tx_size_high[tx_size];
    lVar28 = (long)(int)uVar23;
    uVar34 = (ulong)uVar23;
    uVar35 = 0x20;
    if ((int)uVar23 < 0x20) {
      uVar35 = uVar23;
    }
    if (eob < (int)uVar35) {
      iVar74 = *(int *)(&DAT_0056806c + (long)eob * 4);
    }
    else {
      iVar74 = uVar35 - 1;
    }
    uVar36 = (ulong)((uint)tx_size * 4);
    uVar12 = *(uint *)((long)tx_size_wide + uVar36);
    uVar24 = 0x20;
    if ((int)uVar12 < 0x20) {
      uVar24 = uVar12;
    }
    uVar29 = (int)uVar24 >> 2;
    local_44c0 = 0;
    if (uVar12 != uVar23) {
      if ((int)uVar23 < (int)uVar12) {
        local_44c0 = 1;
        if ((uVar23 * 2 != uVar12) && (local_44c0 = 2, uVar23 * 4 != uVar12)) {
LAB_003feeaf:
          local_44c0 = 0;
        }
      }
      else {
        local_44c0 = -1;
        if ((uVar12 * 2 != uVar23) && (local_44c0 = -2, uVar12 * 4 != uVar23)) goto LAB_003feeaf;
      }
    }
    pcVar2 = av1_inv_txfm_shift_ls[tx_size];
    bVar11 = (byte)(tx_type - 4) >> 1;
    bVar37 = 5 < (byte)(bVar11 | tx_type * -0x80);
    bVar11 = 0x18 >> (bVar11 & 0x1f);
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar36) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[iVar74]];
    uVar30 = iVar74 + 8 >> 2 & 0xfffffffe;
    if (0 < (int)uVar30) {
      p_Var4 = highbd_txfm_all_1d_zeros_w8_arr
               [(long)*(int *)((long)tx_size_wide_log2 + uVar36) + -2][""[tx_type]][0];
      uVar36 = (ulong)uVar24;
      puVar25 = local_4008;
      uVar21 = 0;
      auVar45 = pmovsxwd(in_XMM1,0xb500b500b500b50);
      auVar52 = pmovsxwd(in_XMM2,0x800080008000800);
      do {
        plVar32 = (longlong *)input;
        palVar13 = (__m128i *)&local_4438;
        uVar31 = uVar36;
        do {
          lVar10 = plVar32[1];
          (*palVar13)[0] = *plVar32;
          (*palVar13)[1] = lVar10;
          palVar13 = palVar13 + 1;
          plVar32 = (longlong *)((long)plVar32 + (long)(int)uVar35 * 4);
          uVar31 = uVar31 - 1;
        } while (uVar31 != 0);
        palVar13 = (__m128i *)&local_4438;
        uVar31 = uVar36;
        if ((local_44c0 == 1) || (local_44c0 == -1)) {
          do {
            auVar58 = pmulld((undefined1  [16])*palVar13,auVar45);
            *(int *)*palVar13 = auVar58._0_4_ + auVar52._0_4_ >> 0xc;
            *(int *)((long)*palVar13 + 4) = auVar58._4_4_ + auVar52._4_4_ >> 0xc;
            *(int *)(*palVar13 + 1) = auVar58._8_4_ + auVar52._8_4_ >> 0xc;
            *(int *)((long)*palVar13 + 0xc) = auVar58._12_4_ + auVar52._12_4_ >> 0xc;
            uVar31 = uVar31 - 1;
            palVar13 = palVar13 + 1;
          } while (uVar31 != 0);
        }
        (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
        auVar43._8_8_ = extraout_XMM1_Qb_00;
        auVar43._0_8_ = extraout_XMM1_Qa_00;
        if (0 < (int)uVar29) {
          lVar26 = 0;
          puVar15 = puVar25;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar26 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar26 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar26 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar26 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar26);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar26);
            auVar39._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar26 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar26 + -8));
            auVar39._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar26 + -4);
            auVar39._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar26 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar26);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar26);
            auVar52._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar26),
                          *(undefined4 *)((long)auStack_4418 + lVar26 + 8));
            auVar52._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar26 + 0xc);
            auVar52._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar26 + 4);
            *(undefined1 (*) [16])((long)&local_4438 + lVar26) = in_XMM3;
            *(undefined4 *)((long)auStack_4428 + lVar26 + 8) = uVar7;
            *(undefined4 *)((long)auStack_4428 + lVar26 + 0xc) = uVar5;
            *(undefined4 *)((long)auStack_4418 + lVar26) = uVar8;
            *(undefined4 *)((long)auStack_4418 + lVar26 + 4) = uVar6;
            auVar43._8_8_ = auVar52._0_8_;
            auVar43._0_8_ = auVar39._0_8_;
            *(undefined1 (*) [16])((long)auStack_4418 + lVar26) = auVar43;
            *(long *)((long)&uStack_4408 + lVar26) = auVar39._8_8_;
            *(long *)((long)&uStack_4400 + lVar26) = auVar52._8_8_;
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar43;
            *puVar15 = auVar39._8_8_;
            puVar15[1] = auVar52._8_8_;
            lVar26 = lVar26 + 0x40;
            puVar15 = puVar15 + lVar28 * 2;
          } while ((ulong)uVar29 << 6 != lVar26);
        }
        uVar21 = uVar21 + 1;
        input = (int32_t *)((long)input + 0x10);
        puVar25 = puVar25 + 8;
        auVar45 = pmovsxwd(auVar43,0xb500b500b500b50);
        auVar52 = pmovsxwd(auVar52,0x800080008000800);
      } while (uVar21 != uVar30);
    }
    if (0 < (int)uVar29) {
      plVar32 = local_4038;
      uVar36 = 0;
      do {
        (*p_Var3)((__m128i *)(local_4038 + uVar36 * lVar28 * 2),
                  (__m128i *)(local_4038 + uVar36 * lVar28 * 2),0xc,1,bd,0);
        bVar1 = pcVar2[1];
        plVar17 = plVar32;
        uVar21 = uVar34;
        if ((char)bVar1 < '\0') {
          iVar74 = 1 << (~bVar1 & 0x1f);
          auVar45 = ZEXT416((uint)-(int)(char)bVar1);
          do {
            *(int *)plVar17 = (int)*plVar17 + iVar74 >> auVar45;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar74 >> auVar45;
            *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar74 >> auVar45;
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar74 >> auVar45;
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        else {
          do {
            *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar1;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
            *(int *)(plVar17 + 1) = (int)plVar17[1];
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar36 = uVar36 + 1;
        plVar32 = plVar32 + lVar28 * 2;
      } while (uVar36 != uVar29);
    }
    if (0 < (int)uVar12 >> 3) {
      pauVar20 = (undefined1 (*) [16])((long)output * 2);
      uVar35 = ~(-1 << (bVar18 & 0x1f));
      uVar21 = 0;
      uVar36 = (ulong)(uVar23 - 1);
      if (bVar37 || (bVar11 & 1) != 0) {
        uVar36 = uVar21;
      }
      uVar31 = 0;
      do {
        plVar32 = local_4038 + uVar36 * 2 + (long)(int)uVar21 * 2;
        pauVar16 = pauVar20;
        uVar22 = uVar34;
        do {
          auVar45 = *pauVar16;
          auVar58 = pmovsxwd(in_XMM3,auVar45);
          auVar53._8_4_ = auVar45._8_4_;
          auVar53._12_4_ = auVar45._12_4_;
          auVar53._0_8_ = auVar45._8_8_;
          iVar65 = auVar58._0_4_ + (int)*plVar32;
          iVar72 = auVar58._4_4_ + *(int *)((long)plVar32 + 4);
          iVar73 = auVar58._8_4_ + (int)plVar32[1];
          iVar74 = auVar58._12_4_ + *(int *)((long)plVar32 + 0xc);
          auVar45 = pmovsxwd(auVar53,auVar53);
          plVar17 = plVar32 + uVar34 * 2;
          iVar64 = auVar45._0_4_ + (int)*plVar17;
          iVar47 = auVar45._4_4_ + *(int *)((long)plVar17 + 4);
          iVar62 = auVar45._8_4_ + (int)plVar17[1];
          iVar63 = auVar45._12_4_ + *(int *)((long)plVar17 + 0xc);
          iVar65 = (uint)(-1 < iVar65) * iVar65;
          iVar72 = (uint)(-1 < iVar72) * iVar72;
          iVar73 = (uint)(-1 < iVar73) * iVar73;
          iVar74 = (uint)(-1 < iVar74) * iVar74;
          auVar68._0_4_ = ((int)uVar35 < iVar65) * uVar35 | (uint)((int)uVar35 >= iVar65) * iVar65;
          auVar68._4_4_ = ((int)uVar35 < iVar72) * uVar35 | (uint)((int)uVar35 >= iVar72) * iVar72;
          auVar68._8_4_ = ((int)uVar35 < iVar73) * uVar35 | (uint)((int)uVar35 >= iVar73) * iVar73;
          auVar68._12_4_ = ((int)uVar35 < iVar74) * uVar35 | (uint)((int)uVar35 >= iVar74) * iVar74;
          iVar64 = (uint)(-1 < iVar64) * iVar64;
          iVar47 = (uint)(-1 < iVar47) * iVar47;
          iVar62 = (uint)(-1 < iVar62) * iVar62;
          iVar63 = (uint)(-1 < iVar63) * iVar63;
          auVar54._0_4_ = ((int)uVar35 < iVar64) * uVar35 | (uint)((int)uVar35 >= iVar64) * iVar64;
          auVar54._4_4_ = ((int)uVar35 < iVar47) * uVar35 | (uint)((int)uVar35 >= iVar47) * iVar47;
          auVar54._8_4_ = ((int)uVar35 < iVar62) * uVar35 | (uint)((int)uVar35 >= iVar62) * iVar62;
          auVar54._12_4_ = ((int)uVar35 < iVar63) * uVar35 | (uint)((int)uVar35 >= iVar63) * iVar63;
          in_XMM3 = packusdw(auVar68,auVar54);
          *pauVar16 = in_XMM3;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
          plVar32 = (longlong *)((long)plVar32 + ((ulong)(((bVar37 | bVar11) & 1) << 5) - 0x10));
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
        uVar31 = uVar31 + 1;
        pauVar20 = pauVar20 + 1;
        uVar21 = (ulong)((int)uVar21 + uVar23 * 2);
      } while (uVar31 != (uint)((int)uVar12 >> 3));
    }
    goto switchD_003fd9ca_default;
  case 0xb:
  case 0xd:
  case 0xf:
    break;
  default:
    goto switchD_003fd9ca_default;
  }
  uVar23 = tx_size_wide[tx_size];
  uVar35 = 0x20;
  if ((int)uVar23 < 0x20) {
    uVar35 = uVar23;
  }
  if (eob < (int)uVar35) {
    uVar12 = *(uint *)(&DAT_0056806c + (long)eob * 4);
  }
  else {
    uVar12 = uVar35 - 1;
  }
  uVar34 = (ulong)((uint)tx_size * 4);
  uVar24 = *(uint *)((long)tx_size_high + uVar34);
  uVar36 = (ulong)uVar24;
  uVar29 = 0x20;
  if ((int)uVar24 < 0x20) {
    uVar29 = uVar24;
  }
  local_44c8 = 0;
  if (uVar23 != uVar24) {
    if ((int)uVar24 < (int)uVar23) {
      local_44c8 = 1;
      if ((uVar24 * 2 != uVar23) && (local_44c8 = 2, uVar24 * 4 != uVar23)) {
LAB_003feee8:
        local_44c8 = 0;
      }
    }
    else {
      local_44c8 = -1;
      if ((uVar23 * 2 != uVar24) && (local_44c8 = -2, uVar23 * 4 != uVar24)) goto LAB_003feee8;
    }
  }
  uVar35 = (int)uVar35 >> 2;
  bVar37 = true;
  if (tx_type == '\x0f') {
    bVar37 = false;
LAB_003fe9d0:
    local_4484 = 1;
  }
  else {
    if (tx_type != '\x0e') goto LAB_003fe9d0;
    local_4484 = 0;
  }
  lVar28 = (long)(int)uVar24;
  pcVar2 = av1_inv_txfm_shift_ls[tx_size];
  p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar34) + -2]
           [""[tx_type]][0];
  if (0 < (int)uVar29 >> 2) {
    p_Var4 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_wide_log2 + uVar34) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[(int)uVar12]];
    lVar33 = (ulong)((uVar12 & 0xfffffff8) + 8) << 4;
    lVar26 = (ulong)uVar35 << 6;
    pauVar20 = (undefined1 (*) [16])(local_4008 + ((long)(int)uVar35 + -1) * lVar28 * 2);
    puVar25 = local_4008;
    uVar34 = 0;
    auVar45 = pmovsxwd(in_XMM1,0xb500b500b500b50);
    auVar58 = pmovsxwd(in_XMM2,0x800080008000800);
    do {
      if (-1 < (int)uVar12) {
        lVar19 = 0;
        piVar14 = input;
        do {
          uVar9 = *(undefined8 *)(piVar14 + 2);
          *(undefined8 *)((long)&local_4438 + lVar19) = *(undefined8 *)piVar14;
          *(undefined8 *)((long)auStack_4428 + lVar19 + -8) = uVar9;
          lVar19 = lVar19 + 0x10;
          piVar14 = piVar14 + uVar29;
        } while (lVar33 != lVar19);
      }
      if (((local_44c8 == 1) || (local_44c8 == -1)) && (-1 < (int)uVar12)) {
        lVar19 = 0;
        do {
          auVar41 = pmulld(*(undefined1 (*) [16])((long)&local_4438 + lVar19),auVar45);
          *(int *)((long)&local_4438 + lVar19) = auVar41._0_4_ + auVar58._0_4_ >> 0xc;
          *(int *)((long)&local_4438 + lVar19 + 4) = auVar41._4_4_ + auVar58._4_4_ >> 0xc;
          *(int *)((long)auStack_4428 + lVar19 + -8) = auVar41._8_4_ + auVar58._8_4_ >> 0xc;
          *(int *)((long)auStack_4428 + lVar19 + -4) = auVar41._12_4_ + auVar58._12_4_ >> 0xc;
          lVar19 = lVar19 + 0x10;
        } while (lVar33 != lVar19);
      }
      (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
      auVar45._8_8_ = extraout_XMM1_Qb_02;
      auVar45._0_8_ = extraout_XMM1_Qa_02;
      if (bVar37) {
        if (0 < (int)uVar35) {
          lVar19 = 0;
          puVar15 = puVar25;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar19 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar19);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar19);
            auVar41._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar19 + -8));
            auVar41._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
            auVar41._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar19);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19);
            auVar58._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar19),
                          *(undefined4 *)((long)auStack_4418 + lVar19 + 8));
            auVar58._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
            auVar58._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            auVar45._8_8_ = auVar58._0_8_;
            auVar45._0_8_ = auVar41._0_8_;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar45;
            *puVar15 = auVar41._8_8_;
            puVar15[1] = auVar58._8_8_;
            lVar19 = lVar19 + 0x40;
            puVar15 = puVar15 + lVar28 * 2;
          } while (lVar26 != lVar19);
        }
      }
      else if (0 < (int)uVar35) {
        lVar19 = 0;
        pauVar16 = pauVar20;
        do {
          auVar41 = *(undefined1 (*) [16])((long)auStack_4428 + lVar19);
          uVar5 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
          uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
          auVar70._0_8_ =
               CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19 + 8),
                        *(undefined4 *)((long)&uStack_4400 + lVar19));
          auVar70._8_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
          auVar70._12_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
          auVar59._0_8_ = auVar41._0_8_;
          auVar59._8_4_ = auVar41._4_4_;
          auVar59._12_4_ = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
          auVar58._8_8_ = auVar59._8_8_;
          auVar58._0_8_ = CONCAT44(*(undefined4 *)((long)&local_4438 + lVar19),auVar41._0_4_);
          auVar45._0_8_ = CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + -8),auVar41._8_4_);
          auVar45._8_4_ = auVar41._12_4_;
          auVar45._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
          *(ulong *)pauVar16[-3] =
               CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19),
                        *(undefined4 *)((long)&uStack_4408 + lVar19));
          *(undefined8 *)((long)pauVar16[-3] + 8) = auVar58._0_8_;
          *(undefined4 *)((long)pauVar16[-2] + 8) = uVar6;
          *(undefined4 *)((long)pauVar16[-2] + 0xc) = uVar5;
          *(undefined8 *)((long)pauVar16[-2] + 8) = auVar58._8_8_;
          *(undefined8 *)pauVar16[-1] = auVar70._0_8_;
          *(undefined8 *)((long)pauVar16[-1] + 8) = auVar45._0_8_;
          in_XMM3._8_8_ = auVar45._8_8_;
          in_XMM3._0_8_ = auVar70._8_8_;
          *pauVar16 = in_XMM3;
          lVar19 = lVar19 + 0x40;
          pauVar16 = pauVar16 + -lVar28;
        } while (lVar26 != lVar19);
      }
      uVar34 = uVar34 + 1;
      input = input + 4;
      pauVar20 = pauVar20 + 4;
      puVar25 = puVar25 + 8;
      auVar45 = pmovsxwd(auVar45,0xb500b500b500b50);
      auVar58 = pmovsxwd(auVar58,0x800080008000800);
    } while (uVar34 != (uint)((int)uVar29 >> 2));
  }
  if (0 < (int)uVar35) {
    plVar32 = local_4038;
    uVar34 = 0;
    do {
      (*p_Var3)((__m128i *)(local_4038 + uVar34 * lVar28 * 2),
                (__m128i *)(local_4038 + uVar34 * lVar28 * 2),0xc,1,bd,0);
      bVar11 = pcVar2[1];
      plVar17 = plVar32;
      uVar21 = uVar36;
      if ((char)bVar11 < '\0') {
        iVar74 = 1 << (~bVar11 & 0x1f);
        auVar45 = ZEXT416((uint)-(int)(char)bVar11);
        do {
          *(int *)plVar17 = (int)*plVar17 + iVar74 >> auVar45;
          *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar74 >> auVar45;
          *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar74 >> auVar45;
          *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar74 >> auVar45;
          plVar17 = plVar17 + 2;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      else {
        do {
          *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar11;
          *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
          *(int *)(plVar17 + 1) = (int)plVar17[1];
          *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
          plVar17 = plVar17 + 2;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      uVar34 = uVar34 + 1;
      plVar32 = plVar32 + lVar28 * 2;
    } while (uVar34 != uVar35);
  }
  if (0 < (int)uVar23 >> 3) {
    pauVar20 = (undefined1 (*) [16])((long)output * 2);
    uVar35 = ~(-1 << (bVar18 & 0x1f));
    uVar21 = 0;
    uVar34 = (ulong)(uVar24 - 1);
    if (local_4484 != 0) {
      uVar34 = uVar21;
    }
    uVar31 = 0;
    do {
      plVar32 = local_4038 + uVar34 * 2 + (long)(int)uVar21 * 2;
      uVar22 = uVar36;
      pauVar16 = pauVar20;
      do {
        auVar45 = *pauVar16;
        auVar58 = pmovsxwd(in_XMM3,auVar45);
        auVar60._8_4_ = auVar45._8_4_;
        auVar60._12_4_ = auVar45._12_4_;
        auVar60._0_8_ = auVar45._8_8_;
        iVar65 = auVar58._0_4_ + (int)*plVar32;
        iVar72 = auVar58._4_4_ + *(int *)((long)plVar32 + 4);
        iVar73 = auVar58._8_4_ + (int)plVar32[1];
        iVar74 = auVar58._12_4_ + *(int *)((long)plVar32 + 0xc);
        auVar45 = pmovsxwd(auVar60,auVar60);
        plVar17 = plVar32 + uVar36 * 2;
        iVar47 = auVar45._0_4_ + (int)*plVar17;
        iVar62 = auVar45._4_4_ + *(int *)((long)plVar17 + 4);
        iVar63 = auVar45._8_4_ + (int)plVar17[1];
        iVar64 = auVar45._12_4_ + *(int *)((long)plVar17 + 0xc);
        iVar65 = (uint)(-1 < iVar65) * iVar65;
        iVar72 = (uint)(-1 < iVar72) * iVar72;
        iVar73 = (uint)(-1 < iVar73) * iVar73;
        iVar74 = (uint)(-1 < iVar74) * iVar74;
        auVar71._0_4_ = ((int)uVar35 < iVar65) * uVar35 | (uint)((int)uVar35 >= iVar65) * iVar65;
        auVar71._4_4_ = ((int)uVar35 < iVar72) * uVar35 | (uint)((int)uVar35 >= iVar72) * iVar72;
        auVar71._8_4_ = ((int)uVar35 < iVar73) * uVar35 | (uint)((int)uVar35 >= iVar73) * iVar73;
        auVar71._12_4_ = ((int)uVar35 < iVar74) * uVar35 | (uint)((int)uVar35 >= iVar74) * iVar74;
        iVar47 = (uint)(-1 < iVar47) * iVar47;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar63 = (uint)(-1 < iVar63) * iVar63;
        iVar64 = (uint)(-1 < iVar64) * iVar64;
        auVar61._0_4_ = ((int)uVar35 < iVar47) * uVar35 | (uint)((int)uVar35 >= iVar47) * iVar47;
        auVar61._4_4_ = ((int)uVar35 < iVar62) * uVar35 | (uint)((int)uVar35 >= iVar62) * iVar62;
        auVar61._8_4_ = ((int)uVar35 < iVar63) * uVar35 | (uint)((int)uVar35 >= iVar63) * iVar63;
        auVar61._12_4_ = ((int)uVar35 < iVar64) * uVar35 | (uint)((int)uVar35 >= iVar64) * iVar64;
        in_XMM3 = packusdw(auVar71,auVar61);
        *pauVar16 = in_XMM3;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
        plVar32 = plVar32 + (ulong)local_4484 * 4 + -2;
        uVar22 = uVar22 - 1;
      } while (uVar22 != 0);
      uVar31 = uVar31 + 1;
      pauVar20 = pauVar20 + 1;
      uVar21 = (ulong)((int)uVar21 + uVar24 * 2);
    } while (uVar31 != (uint)((int)uVar23 >> 3));
  }
switchD_003fd9ca_default:
  return;
}

Assistant:

void av1_highbd_inv_txfm2d_add_universe_sse4_1(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob, const int bd) {
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:
    case DCT_ADST:
    case ADST_ADST:
    case FLIPADST_DCT:
    case DCT_FLIPADST:
    case FLIPADST_FLIPADST:
    case ADST_FLIPADST:
    case FLIPADST_ADST:
      highbd_inv_txfm2d_add_no_identity_sse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      highbd_inv_txfm2d_add_h_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      highbd_inv_txfm2d_add_v_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case IDTX:
      highbd_inv_txfm2d_add_idtx_ssse41(input, CONVERT_TO_SHORTPTR(output),
                                        stride, tx_type, tx_size, eob, bd);
      break;
    default: assert(0); break;
  }
}